

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void __thiscall ThreadParser::addToCheckSum(ThreadParser *this,XMLCh *chars,XMLSize_t len)

{
  ulong local_28;
  XMLSize_t i;
  XMLSize_t len_local;
  XMLCh *chars_local;
  ThreadParser *this_local;
  
  len_local = (XMLSize_t)chars;
  if (len == 0xffffffffffffffff) {
    for (; *(short *)len_local != 0; len_local = len_local + 2) {
      this->fCheckSum = this->fCheckSum * 5 + (uint)*(ushort *)len_local;
    }
  }
  else {
    for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
      this->fCheckSum = this->fCheckSum * 5 + (uint)(ushort)chars[local_28];
    }
  }
  return;
}

Assistant:

void ThreadParser::addToCheckSum(const XMLCh *chars, XMLSize_t len)
{
    if (len == (XMLSize_t)-1)
    {
        // Null terminated string.
        while (*chars != 0)
        {
            fCheckSum = fCheckSum*5 + *chars;
            chars++;
        }
    }
    else
    {
        // String with character count.
        XMLSize_t i;
        for (i=0; i<len; i++)
            fCheckSum = fCheckSum*5 + chars[i];
    }
}